

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___newindex(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  CTState *cts_00;
  lua_State *in_RDI;
  CTInfo qual;
  CType *d;
  GCcdata *cd;
  CTState *cts;
  TValue *o;
  TValue *tv;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  
  pTVar2 = ffi_clib_index(in_stack_ffffffffffffff70);
  if ((in_RDI->base + 2 < in_RDI->top) && ((pTVar2->field_2).it == 0xfffffff5)) {
    cts_00 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0xfc);
    cts_00->L = in_RDI;
    in_stack_ffffffffffffff70 =
         (lua_State *)(cts_00->tab + *(ushort *)((ulong)(pTVar2->u32).lo + 6));
    if ((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x1c == 0xc) {
      in_stack_ffffffffffffff6c = LJ_ERR_ERRMEM;
      while( true ) {
        uVar1 = (in_stack_ffffffffffffff70->nextgc).gcptr32;
        in_stack_ffffffffffffff70 = (lua_State *)(cts_00->tab + (uVar1 & 0xffff));
        if ((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x1c != 8) break;
        if (((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x10 & 0xff) == 1) {
          in_stack_ffffffffffffff6c =
               *(ErrMsg *)&in_stack_ffffffffffffff70->marked | in_stack_ffffffffffffff6c;
        }
      }
      if ((((in_stack_ffffffffffffff70->nextgc).gcptr32 | in_stack_ffffffffffffff6c) & 0x2000000) ==
          LJ_ERR_ERRMEM) {
        lj_cconv_ct_tv(cts_00,(CType *)(CONCAT44(uVar1,in_stack_ffffffffffffffd0) & 0xffffffffffff),
                       (uint8_t *)cts_00,
                       (TValue *)(CONCAT44(uVar1,in_stack_ffffffffffffffc0) & 0xffffffffffff),0);
        return 0;
      }
    }
  }
  lj_err_caller(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
}

Assistant:

LJLIB_CF(ffi_clib___newindex)	LJLIB_REC(clib_index 0)
{
  TValue *tv = ffi_clib_index(L);
  TValue *o = L->base+2;
  if (o < L->top && tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *d = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(d->info)) {
      CTInfo qual = 0;
      for (;;) {  /* Skip attributes and collect qualifiers. */
	d = ctype_child(cts, d);
	if (!ctype_isattrib(d->info)) break;
	if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
      }
      if (!((d->info|qual) & CTF_CONST)) {
	lj_cconv_ct_tv(cts, d, *(void **)cdataptr(cd), o, 0);
	return 0;
      }
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_WRCONST);
  return 0;  /* unreachable */
}